

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_16777232,_false,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::ObjectIntersectorK<8,_true>_>,_false>
     ::intersect(vint<8> *valid_i,Intersectors *This,RayHitK<8> *ray,RayQueryContext *context)

{
  undefined1 (*pauVar1) [32];
  undefined4 uVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  ulong uVar11;
  _func_int **pp_Var12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  AABBNodeMB4D *node1;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  ulong *puVar20;
  undefined1 (*pauVar21) [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  vint<8> mask;
  NodeRef stack_node [241];
  vfloat<8> stack_near [241];
  undefined1 local_27c0 [32];
  RTCIntersectFunctionNArguments local_2788;
  Geometry *local_2758;
  undefined8 local_2750;
  RTCIntersectArguments *local_2748;
  undefined1 local_2740 [32];
  undefined1 local_2720 [32];
  undefined1 local_2700 [32];
  undefined1 local_26e0 [32];
  float local_26c0;
  float fStack_26bc;
  float fStack_26b8;
  float fStack_26b4;
  float fStack_26b0;
  float fStack_26ac;
  float fStack_26a8;
  uint uStack_26a4;
  float local_26a0;
  float fStack_269c;
  float fStack_2698;
  float fStack_2694;
  float fStack_2690;
  float fStack_268c;
  float fStack_2688;
  uint uStack_2684;
  undefined1 local_2680 [32];
  undefined1 local_2660 [32];
  undefined1 local_2640 [32];
  undefined8 uStack_2610;
  ulong local_2608 [241];
  undefined1 local_1e80 [32];
  undefined1 local_1e60 [32];
  undefined1 local_1e40 [7696];
  
  uVar19 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (uVar19 != 8) {
    auVar23 = vpcmpeqd_avx2(in_ZMM1._0_32_,in_ZMM1._0_32_);
    auVar23 = vpcmpeqd_avx2((undefined1  [32])valid_i->field_0,auVar23);
    if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar23 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar23 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar23 >> 0x7f,0) != '\0') ||
          (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar23 >> 0xbf,0) != '\0') ||
        (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar23[0x1f] < '\0')
    {
      auVar27 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x60),ZEXT1632(ZEXT816(0) << 0x40));
      local_1e80._8_4_ = 0x7f800000;
      local_1e80._0_8_ = 0x7f8000007f800000;
      local_1e80._12_4_ = 0x7f800000;
      local_1e80._16_4_ = 0x7f800000;
      local_1e80._20_4_ = 0x7f800000;
      local_1e80._24_4_ = 0x7f800000;
      local_1e80._28_4_ = 0x7f800000;
      auVar44 = ZEXT3264(local_1e80);
      local_2660 = vblendvps_avx(local_1e80,auVar27,auVar23);
      uStack_26a4 = *(uint *)(ray + 0x1c) ^ 0x80000000;
      auVar23 = *(undefined1 (*) [32])(ray + 0x20);
      auVar27 = *(undefined1 (*) [32])(ray + 0x40);
      uStack_2610 = 0xfffffffffffffff8;
      local_2608[0] = uVar19;
      local_1e60 = local_2660;
      if (uVar19 != 0xfffffffffffffff8) {
        auVar22._8_4_ = 0x7fffffff;
        auVar22._0_8_ = 0x7fffffff7fffffff;
        auVar22._12_4_ = 0x7fffffff;
        auVar22._16_4_ = 0x7fffffff;
        auVar22._20_4_ = 0x7fffffff;
        auVar22._24_4_ = 0x7fffffff;
        auVar22._28_4_ = 0x7fffffff;
        auVar26 = vandps_avx(auVar22,*(undefined1 (*) [32])(ray + 0x80));
        auVar42._8_4_ = 0x219392ef;
        auVar42._0_8_ = 0x219392ef219392ef;
        auVar42._12_4_ = 0x219392ef;
        auVar42._16_4_ = 0x219392ef;
        auVar42._20_4_ = 0x219392ef;
        auVar42._24_4_ = 0x219392ef;
        auVar42._28_4_ = 0x219392ef;
        auVar26 = vcmpps_avx(auVar26,auVar42,1);
        auVar3 = vblendvps_avx(*(undefined1 (*) [32])(ray + 0x80),auVar42,auVar26);
        auVar26 = vandps_avx(auVar22,*(undefined1 (*) [32])(ray + 0xa0));
        auVar26 = vcmpps_avx(auVar26,auVar42,1);
        auVar4 = vblendvps_avx(*(undefined1 (*) [32])(ray + 0xa0),auVar42,auVar26);
        auVar26 = vandps_avx(auVar22,*(undefined1 (*) [32])(ray + 0xc0));
        auVar26 = vcmpps_avx(auVar26,auVar42,1);
        auVar22 = vrcpps_avx(auVar3);
        auVar26 = vblendvps_avx(*(undefined1 (*) [32])(ray + 0xc0),auVar42,auVar26);
        auVar32._8_4_ = 0x3f800000;
        auVar32._0_8_ = 0x3f8000003f800000;
        auVar32._12_4_ = 0x3f800000;
        auVar32._16_4_ = 0x3f800000;
        auVar32._20_4_ = 0x3f800000;
        auVar32._24_4_ = 0x3f800000;
        auVar32._28_4_ = 0x3f800000;
        auVar8 = vfnmadd213ps_fma(auVar3,auVar22,auVar32);
        auVar3 = vrcpps_avx(auVar4);
        auVar9 = vfnmadd213ps_fma(auVar4,auVar3,auVar32);
        auVar4 = vrcpps_avx(auVar26);
        auVar10 = vfnmadd213ps_fma(auVar26,auVar4,auVar32);
        auVar8 = vfmadd132ps_fma(ZEXT1632(auVar8),auVar22,auVar22);
        auVar45 = ZEXT1664(auVar8);
        auVar9 = vfmadd132ps_fma(ZEXT1632(auVar9),auVar3,auVar3);
        auVar46 = ZEXT1664(auVar9);
        auVar10 = vfmadd132ps_fma(ZEXT1632(auVar10),auVar4,auVar4);
        local_26a0 = auVar8._0_4_ * -*(float *)ray;
        fStack_269c = auVar8._4_4_ * -*(float *)(ray + 4);
        fStack_2698 = auVar8._8_4_ * -*(float *)(ray + 8);
        fStack_2694 = auVar8._12_4_ * -*(float *)(ray + 0xc);
        fStack_2690 = -*(float *)(ray + 0x10) * 0.0;
        fStack_268c = -*(float *)(ray + 0x14) * 0.0;
        fStack_2688 = -*(float *)(ray + 0x18) * 0.0;
        local_26c0 = auVar9._0_4_ * -auVar23._0_4_;
        fStack_26bc = auVar9._4_4_ * -auVar23._4_4_;
        fStack_26b8 = auVar9._8_4_ * -auVar23._8_4_;
        fStack_26b4 = auVar9._12_4_ * -auVar23._12_4_;
        fStack_26b0 = -auVar23._16_4_ * 0.0;
        fStack_26ac = -auVar23._20_4_ * 0.0;
        fStack_26a8 = -auVar23._24_4_ * 0.0;
        local_2680 = ZEXT1632(auVar10);
        local_26e0._4_4_ = auVar10._4_4_ * -auVar27._4_4_;
        local_26e0._0_4_ = auVar10._0_4_ * -auVar27._0_4_;
        local_26e0._8_4_ = auVar10._8_4_ * -auVar27._8_4_;
        local_26e0._12_4_ = auVar10._12_4_ * -auVar27._12_4_;
        local_26e0._16_4_ = -auVar27._16_4_ * 0.0;
        local_26e0._20_4_ = -auVar27._20_4_ * 0.0;
        local_26e0._24_4_ = -auVar27._24_4_ * 0.0;
        local_26e0._28_4_ = uStack_26a4;
        auVar23 = vpcmpeqd_avx2(local_26e0,local_26e0);
        auVar27 = vpcmpeqd_avx2((undefined1  [32])valid_i->field_0,auVar23);
        puVar20 = local_2608;
        auVar26._8_4_ = 0xff800000;
        auVar26._0_8_ = 0xff800000ff800000;
        auVar26._12_4_ = 0xff800000;
        auVar26._16_4_ = 0xff800000;
        auVar26._20_4_ = 0xff800000;
        auVar26._24_4_ = 0xff800000;
        auVar26._28_4_ = 0xff800000;
        auVar23 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(ZEXT816(0) << 0x40));
        local_27c0 = vblendvps_avx(auVar26,auVar23,auVar27);
        pauVar21 = (undefined1 (*) [32])local_1e40;
        local_2720 = ZEXT1632(auVar8);
        local_2740 = ZEXT1632(auVar9);
        uStack_2684 = uStack_26a4;
        do {
          pauVar1 = pauVar21 + -1;
          auVar24 = ZEXT3264(*pauVar1);
          pauVar21 = pauVar21 + -1;
          auVar23 = vcmpps_avx(*pauVar1,local_27c0,1);
          if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar23 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar23 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar23 >> 0x7f,0) != '\0') ||
                (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar23 >> 0xbf,0) != '\0') ||
              (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar23[0x1f] < '\0') {
            while( true ) {
              uVar18 = (uint)uVar19;
              if ((uVar19 & 8) != 0) break;
              uVar17 = uVar19 & 0xfffffffffffffff0;
              auVar23 = vcmpps_avx(local_27c0,auVar24._0_32_,6);
              uVar11 = 0;
              auVar24 = ZEXT3264(auVar44._0_32_);
              lVar13 = -0x10;
              uVar19 = 8;
              do {
                uVar15 = *(ulong *)(uVar17 + 0x20 + lVar13 * 2);
                if (uVar15 == 8) break;
                uVar2 = *(undefined4 *)(uVar17 + 0x90 + lVar13);
                auVar29._4_4_ = uVar2;
                auVar29._0_4_ = uVar2;
                auVar29._8_4_ = uVar2;
                auVar29._12_4_ = uVar2;
                auVar29._16_4_ = uVar2;
                auVar29._20_4_ = uVar2;
                auVar29._24_4_ = uVar2;
                auVar29._28_4_ = uVar2;
                uVar2 = *(undefined4 *)(uVar17 + 0x30 + lVar13);
                auVar28._4_4_ = uVar2;
                auVar28._0_4_ = uVar2;
                auVar28._8_4_ = uVar2;
                auVar28._12_4_ = uVar2;
                auVar28._16_4_ = uVar2;
                auVar28._20_4_ = uVar2;
                auVar28._24_4_ = uVar2;
                auVar28._28_4_ = uVar2;
                auVar27 = *(undefined1 (*) [32])(ray + 0xe0);
                uVar2 = *(undefined4 *)(uVar17 + 0xb0 + lVar13);
                auVar35._4_4_ = uVar2;
                auVar35._0_4_ = uVar2;
                auVar35._8_4_ = uVar2;
                auVar35._12_4_ = uVar2;
                auVar35._16_4_ = uVar2;
                auVar35._20_4_ = uVar2;
                auVar35._24_4_ = uVar2;
                auVar35._28_4_ = uVar2;
                auVar8 = vfmadd231ps_fma(auVar28,auVar27,auVar29);
                uVar2 = *(undefined4 *)(uVar17 + 0x50 + lVar13);
                auVar33._4_4_ = uVar2;
                auVar33._0_4_ = uVar2;
                auVar33._8_4_ = uVar2;
                auVar33._12_4_ = uVar2;
                auVar33._16_4_ = uVar2;
                auVar33._20_4_ = uVar2;
                auVar33._24_4_ = uVar2;
                auVar33._28_4_ = uVar2;
                auVar9 = vfmadd231ps_fma(auVar33,auVar27,auVar35);
                uVar2 = *(undefined4 *)(uVar17 + 0xd0 + lVar13);
                auVar30._4_4_ = uVar2;
                auVar30._0_4_ = uVar2;
                auVar30._8_4_ = uVar2;
                auVar30._12_4_ = uVar2;
                auVar30._16_4_ = uVar2;
                auVar30._20_4_ = uVar2;
                auVar30._24_4_ = uVar2;
                auVar30._28_4_ = uVar2;
                uVar2 = *(undefined4 *)(uVar17 + 0x70 + lVar13);
                auVar36._4_4_ = uVar2;
                auVar36._0_4_ = uVar2;
                auVar36._8_4_ = uVar2;
                auVar36._12_4_ = uVar2;
                auVar36._16_4_ = uVar2;
                auVar36._20_4_ = uVar2;
                auVar36._24_4_ = uVar2;
                auVar36._28_4_ = uVar2;
                uVar2 = *(undefined4 *)(uVar17 + 0xa0 + lVar13);
                auVar38._4_4_ = uVar2;
                auVar38._0_4_ = uVar2;
                auVar38._8_4_ = uVar2;
                auVar38._12_4_ = uVar2;
                auVar38._16_4_ = uVar2;
                auVar38._20_4_ = uVar2;
                auVar38._24_4_ = uVar2;
                auVar38._28_4_ = uVar2;
                uVar2 = *(undefined4 *)(uVar17 + 0x40 + lVar13);
                auVar40._4_4_ = uVar2;
                auVar40._0_4_ = uVar2;
                auVar40._8_4_ = uVar2;
                auVar40._12_4_ = uVar2;
                auVar40._16_4_ = uVar2;
                auVar40._20_4_ = uVar2;
                auVar40._24_4_ = uVar2;
                auVar40._28_4_ = uVar2;
                auVar10 = vfmadd231ps_fma(auVar36,auVar27,auVar30);
                auVar5 = vfmadd231ps_fma(auVar40,auVar27,auVar38);
                uVar2 = *(undefined4 *)(uVar17 + 0xc0 + lVar13);
                auVar31._4_4_ = uVar2;
                auVar31._0_4_ = uVar2;
                auVar31._8_4_ = uVar2;
                auVar31._12_4_ = uVar2;
                auVar31._16_4_ = uVar2;
                auVar31._20_4_ = uVar2;
                auVar31._24_4_ = uVar2;
                auVar31._28_4_ = uVar2;
                uVar2 = *(undefined4 *)(uVar17 + 0x60 + lVar13);
                auVar39._4_4_ = uVar2;
                auVar39._0_4_ = uVar2;
                auVar39._8_4_ = uVar2;
                auVar39._12_4_ = uVar2;
                auVar39._16_4_ = uVar2;
                auVar39._20_4_ = uVar2;
                auVar39._24_4_ = uVar2;
                auVar39._28_4_ = uVar2;
                uVar2 = *(undefined4 *)(uVar17 + 0xe0 + lVar13);
                auVar41._4_4_ = uVar2;
                auVar41._0_4_ = uVar2;
                auVar41._8_4_ = uVar2;
                auVar41._12_4_ = uVar2;
                auVar41._16_4_ = uVar2;
                auVar41._20_4_ = uVar2;
                auVar41._24_4_ = uVar2;
                auVar41._28_4_ = uVar2;
                auVar6 = vfmadd231ps_fma(auVar39,auVar27,auVar31);
                uVar2 = *(undefined4 *)(uVar17 + 0x80 + lVar13);
                auVar43._4_4_ = uVar2;
                auVar43._0_4_ = uVar2;
                auVar43._8_4_ = uVar2;
                auVar43._12_4_ = uVar2;
                auVar43._16_4_ = uVar2;
                auVar43._20_4_ = uVar2;
                auVar43._24_4_ = uVar2;
                auVar43._28_4_ = uVar2;
                auVar7 = vfmadd231ps_fma(auVar43,auVar27,auVar41);
                auVar4._4_4_ = fStack_269c;
                auVar4._0_4_ = local_26a0;
                auVar4._8_4_ = fStack_2698;
                auVar4._12_4_ = fStack_2694;
                auVar4._16_4_ = fStack_2690;
                auVar4._20_4_ = fStack_268c;
                auVar4._24_4_ = fStack_2688;
                auVar4._28_4_ = uStack_2684;
                auVar8 = vfmadd213ps_fma(ZEXT1632(auVar8),auVar45._0_32_,auVar4);
                auVar3._4_4_ = fStack_26bc;
                auVar3._0_4_ = local_26c0;
                auVar3._8_4_ = fStack_26b8;
                auVar3._12_4_ = fStack_26b4;
                auVar3._16_4_ = fStack_26b0;
                auVar3._20_4_ = fStack_26ac;
                auVar3._24_4_ = fStack_26a8;
                auVar3._28_4_ = uStack_26a4;
                auVar9 = vfmadd213ps_fma(ZEXT1632(auVar9),auVar46._0_32_,auVar3);
                auVar10 = vfmadd213ps_fma(ZEXT1632(auVar10),local_2680,local_26e0);
                auVar5 = vfmadd213ps_fma(ZEXT1632(auVar5),auVar45._0_32_,auVar4);
                auVar6 = vfmadd213ps_fma(ZEXT1632(auVar6),auVar46._0_32_,auVar3);
                auVar7 = vfmadd213ps_fma(ZEXT1632(auVar7),local_2680,local_26e0);
                auVar26 = vpminsd_avx2(ZEXT1632(auVar8),ZEXT1632(auVar5));
                auVar3 = vpminsd_avx2(ZEXT1632(auVar9),ZEXT1632(auVar6));
                auVar26 = vpmaxsd_avx2(auVar26,auVar3);
                auVar3 = vpminsd_avx2(ZEXT1632(auVar10),ZEXT1632(auVar7));
                auVar3 = vpmaxsd_avx2(auVar26,auVar3);
                auVar26 = vpmaxsd_avx2(ZEXT1632(auVar8),ZEXT1632(auVar5));
                auVar4 = vpmaxsd_avx2(ZEXT1632(auVar9),ZEXT1632(auVar6));
                auVar4 = vpminsd_avx2(auVar26,auVar4);
                auVar26 = vpmaxsd_avx2(ZEXT1632(auVar10),ZEXT1632(auVar7));
                auVar26 = vpminsd_avx2(auVar26,local_27c0);
                auVar4 = vpminsd_avx2(auVar4,auVar26);
                auVar26 = vpmaxsd_avx2(auVar3,local_2660);
                auVar26 = vcmpps_avx(auVar26,auVar4,2);
                if ((uVar18 & 7) == 6) {
                  uVar2 = *(undefined4 *)(uVar17 + 0xf0 + lVar13);
                  auVar34._4_4_ = uVar2;
                  auVar34._0_4_ = uVar2;
                  auVar34._8_4_ = uVar2;
                  auVar34._12_4_ = uVar2;
                  auVar34._16_4_ = uVar2;
                  auVar34._20_4_ = uVar2;
                  auVar34._24_4_ = uVar2;
                  auVar34._28_4_ = uVar2;
                  auVar4 = vcmpps_avx(auVar34,auVar27,2);
                  uVar2 = *(undefined4 *)(uVar17 + 0x100 + lVar13);
                  auVar37._4_4_ = uVar2;
                  auVar37._0_4_ = uVar2;
                  auVar37._8_4_ = uVar2;
                  auVar37._12_4_ = uVar2;
                  auVar37._16_4_ = uVar2;
                  auVar37._20_4_ = uVar2;
                  auVar37._24_4_ = uVar2;
                  auVar37._28_4_ = uVar2;
                  auVar27 = vcmpps_avx(auVar27,auVar37,1);
                  auVar27 = vandps_avx(auVar4,auVar27);
                  auVar27 = vandps_avx(auVar27,auVar26);
                  auVar8 = vpackssdw_avx(auVar27._0_16_,auVar27._16_16_);
                }
                else {
                  auVar8 = vpackssdw_avx(auVar26._0_16_,auVar26._16_16_);
                }
                auVar9 = vpackssdw_avx(auVar23._0_16_,auVar23._16_16_);
                auVar8 = vpand_avx(auVar8,auVar9);
                auVar27 = vpmovzxwd_avx2(auVar8);
                auVar27 = vpslld_avx2(auVar27,0x1f);
                if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar27 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar27 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar27 >> 0x7f,0) != '\0') ||
                      (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar27 >> 0xbf,0) != '\0') ||
                    (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar27[0x1f] < '\0') {
                  auVar27 = vblendvps_avx(auVar44._0_32_,auVar3,auVar27);
                  auVar22 = auVar24._0_32_;
                  auVar26 = vcmpps_avx(auVar27,auVar22,1);
                  uVar14 = uVar19;
                  uVar16 = uVar15;
                  auVar4 = auVar22;
                  auVar3 = auVar27;
                  if (((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                            (auVar26 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           (auVar26 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          SUB321(auVar26 >> 0x7f,0) == '\0') &&
                         (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        SUB321(auVar26 >> 0xbf,0) == '\0') &&
                       (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       -1 < auVar26[0x1f]) ||
                     (uVar14 = uVar15, uVar16 = uVar19, auVar4 = auVar27, auVar3 = auVar22,
                     uVar19 != 8)) {
                    auVar27 = auVar4;
                    uVar11 = uVar11 + 1;
                    *puVar20 = uVar16;
                    puVar20 = puVar20 + 1;
                    *pauVar21 = auVar3;
                    pauVar21 = pauVar21 + 1;
                    uVar15 = uVar14;
                  }
                  auVar24 = ZEXT3264(auVar27);
                  uVar19 = uVar15;
                }
                lVar13 = lVar13 + 4;
              } while (lVar13 != 0);
              if (uVar19 == 8) goto LAB_0054f710;
              if (1 < uVar11) {
                auVar23 = pauVar21[-2];
                auVar27 = pauVar21[-1];
                auVar3 = vcmpps_avx(auVar23,auVar27,1);
                auVar26 = auVar27;
                if ((((((((auVar3 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar3 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar3 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar3 >> 0x7f,0) != '\0') ||
                      (auVar3 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar3 >> 0xbf,0) != '\0') ||
                    (auVar3 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar3[0x1f] < '\0') {
                  pauVar21[-2] = auVar27;
                  pauVar21[-1] = auVar23;
                  auVar8 = vpermilps_avx(*(undefined1 (*) [16])(puVar20 + -2),0x4e);
                  *(undefined1 (*) [16])(puVar20 + -2) = auVar8;
                  auVar26 = auVar23;
                  auVar23 = auVar27;
                }
                if (uVar11 != 2) {
                  auVar27 = pauVar21[-3];
                  auVar3 = vcmpps_avx(auVar27,auVar26,1);
                  if ((((((((auVar3 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar3 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar3 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar3 >> 0x7f,0) != '\0') ||
                        (auVar3 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar3 >> 0xbf,0) != '\0') ||
                      (auVar3 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar3[0x1f] < '\0') {
                    pauVar21[-3] = auVar26;
                    pauVar21[-1] = auVar27;
                    uVar11 = puVar20[-3];
                    puVar20[-3] = puVar20[-1];
                    puVar20[-1] = uVar11;
                    auVar27 = auVar26;
                  }
                  auVar26 = vcmpps_avx(auVar27,auVar23,1);
                  if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar26 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar26 >> 0x7f,0) != '\0') ||
                        (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar26 >> 0xbf,0) != '\0') ||
                      (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar26[0x1f] < '\0') {
                    pauVar21[-3] = auVar23;
                    pauVar21[-2] = auVar27;
                    auVar8 = vpermilps_avx(*(undefined1 (*) [16])(puVar20 + -3),0x4e);
                    *(undefined1 (*) [16])(puVar20 + -3) = auVar8;
                  }
                }
              }
            }
            if (uVar19 == 0xfffffffffffffff8) {
              return;
            }
            auVar23 = vcmpps_avx(local_27c0,auVar24._0_32_,6);
            auVar24 = ZEXT3264(auVar23);
            if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar23 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar23 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar23 >> 0x7f,0) != '\0') ||
                  (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar23 >> 0xbf,0) != '\0') ||
                (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar23[0x1f] < '\0') {
              uVar11 = (ulong)(uVar18 & 0xf);
              auVar25 = ZEXT864(0) << 0x20;
              if (uVar11 != 8) {
                lVar13 = 0;
                local_2700 = auVar23;
                do {
                  local_2788.geomID = *(uint *)((uVar19 & 0xfffffffffffffff0) + lVar13 * 8);
                  local_2758 = (context->scene->geometries).items[local_2788.geomID].ptr;
                  uVar18 = local_2758->mask;
                  auVar23._4_4_ = uVar18;
                  auVar23._0_4_ = uVar18;
                  auVar23._8_4_ = uVar18;
                  auVar23._12_4_ = uVar18;
                  auVar23._16_4_ = uVar18;
                  auVar23._20_4_ = uVar18;
                  auVar23._24_4_ = uVar18;
                  auVar23._28_4_ = uVar18;
                  auVar23 = vpand_avx2(auVar23,*(undefined1 (*) [32])(ray + 0x120));
                  auVar27 = vpcmpeqd_avx2(auVar23,auVar25._0_32_);
                  auVar23 = auVar24._0_32_ & ~auVar27;
                  if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar23 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar23 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar23 >> 0x7f,0) != '\0') ||
                        (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar23 >> 0xbf,0) != '\0') ||
                      (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar23[0x1f] < '\0') {
                    local_2640 = vandnps_avx(auVar27,auVar24._0_32_);
                    local_2788.primID = *(uint *)((uVar19 & 0xfffffffffffffff0) + 4 + lVar13 * 8);
                    local_2788.valid = (int *)local_2640;
                    local_2788.geometryUserPtr = local_2758->userPtr;
                    local_2788.context = context->user;
                    local_2788.N = 8;
                    local_2750 = 0;
                    local_2748 = context->args;
                    pp_Var12 = (_func_int **)local_2748->intersect;
                    if (pp_Var12 == (_func_int **)0x0) {
                      pp_Var12 = local_2758[1].super_RefCount._vptr_RefCount;
                    }
                    local_2788.rayhit = (RTCRayHitN *)ray;
                    (*(code *)pp_Var12)(&local_2788);
                    auVar25 = ZEXT1664(ZEXT816(0) << 0x40);
                    auVar44 = ZEXT3264(CONCAT428(0x7f800000,
                                                 CONCAT424(0x7f800000,
                                                           CONCAT420(0x7f800000,
                                                                     CONCAT416(0x7f800000,
                                                                               CONCAT412(0x7f800000,
                                                                                         CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
                    auVar45 = ZEXT3264(local_2720);
                    auVar46 = ZEXT3264(local_2740);
                    auVar24 = ZEXT3264(local_2700);
                  }
                  auVar23 = auVar24._0_32_;
                  lVar13 = lVar13 + 1;
                } while (uVar11 - 8 != lVar13);
              }
              local_27c0 = vblendvps_avx(local_27c0,*(undefined1 (*) [32])(ray + 0x100),auVar23);
            }
          }
LAB_0054f710:
          uVar19 = puVar20[-1];
          puVar20 = puVar20 + -1;
        } while (uVar19 != 0xfffffffffffffff8);
      }
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect(vint<K>* __restrict__ valid_i,
                                                                                               Accel::Intersectors* __restrict__ This,
                                                                                               RayHitK<K>& __restrict__ ray,
                                                                                               RayQueryContext* __restrict__ context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
            
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        intersectCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out invalid rays */
      vbool<K> valid = *valid_i == -1;
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      size_t valid_bits = movemask(valid);

#if defined(__AVX__)
      STAT3(normal.trav_hit_boxes[popcnt(movemask(valid))], 1, 1, 1);
#endif

      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      if (single)
      {
        tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));
        
        for (; valid_bits!=0; ) {
          const size_t i = bscf(valid_bits);
          intersect1(This, bvh, bvh->root, i, pre, ray, tray, context);
        }
        return;
      }

       /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      vint<K> octant = ray.octant();
      octant = select(valid, octant, vint<K>(0xffffffff));

      /* test whether we have ray with opposing direction signs in the packet */
      bool split = false;
      {
        size_t bits = valid_bits;
        vbool<K> vsplit( false );
        do
        {
          const size_t valid_index = bsf(bits);
          vbool<K> octant_valid = octant[valid_index] == octant;
          bits &= ~(size_t)movemask(octant_valid);
          vsplit |= vint<K>(octant[valid_index]) == (octant^vint<K>(0x7));
        } while (bits);
        if (any(vsplit)) split = true;
      }

      do
      {
        const size_t valid_index = bsf(valid_bits);
        const vint<K> diff_octant = vint<K>(octant[valid_index])^octant;
        const vint<K> count_diff_octant = \
          ((diff_octant >> 2) & 1) +
          ((diff_octant >> 1) & 1) +
          ((diff_octant >> 0) & 1);

        vbool<K> octant_valid = (count_diff_octant <= 1) & (octant != vint<K>(0xffffffff));
        if (!single || !split) octant_valid = valid; // deactivate octant sorting in pure chunk mode, otherwise instance traversal performance goes down 


        octant = select(octant_valid,vint<K>(0xffffffff),octant);
        valid_bits &= ~(size_t)movemask(octant_valid);

        tray.tnear = select(octant_valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(octant_valid, org_ray_tfar , vfloat<K>(neg_inf));

        /* allocate stack and push root node */
        vfloat<K> stack_near[stackSizeChunk];
        NodeRef stack_node[stackSizeChunk];
        stack_node[0] = BVH::invalidNode;
        stack_near[0] = inf;
        stack_node[1] = bvh->root;
        stack_near[1] = tray.tnear;
        NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
        NodeRef* __restrict__ sptr_node = stack_node + 2;
        vfloat<K>* __restrict__ sptr_near = stack_near + 2;

        while (1) pop:
        {
          /* pop next node from stack */
          assert(sptr_node > stack_node);
          sptr_node--;
          sptr_near--;
          NodeRef cur = *sptr_node;
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* cull node if behind closest hit point */
          vfloat<K> curDist = *sptr_near;
          const vbool<K> active = curDist < tray.tfar;
          if (unlikely(none(active)))
            continue;

          /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
          if (single)
#endif
          {
            size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
            if (unlikely(popcnt(bits) <= switchThreshold))
#endif
            {
              for (; bits!=0; ) {
                const size_t i = bscf(bits);
                intersect1(This, bvh, cur, i, pre, ray, tray, context);
              }
              tray.tfar = min(tray.tfar, ray.tfar);
              continue;
            }
          }
#endif
          while (likely(!cur.isLeaf()))
          {
            /* process nodes */
            const vbool<K> valid_node = tray.tfar > curDist;
            STAT3(normal.trav_nodes, 1, popcnt(valid_node), K);
            const NodeRef nodeRef = cur;
            const BaseNode* __restrict__ const node = nodeRef.baseNode();

            /* set cur to invalid */
            cur = BVH::emptyNode;
            curDist = pos_inf;

            size_t num_child_hits = 0;

            for (unsigned i = 0; i < N; i++)
            {
              const NodeRef child = node->children[i];
              if (unlikely(child == BVH::emptyNode)) break;
              vfloat<K> lnearP;
              vbool<K> lhit = valid_node;
              BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

              /* if we hit the child we choose to continue with that child if it
                 is closer than the current next child, or we push it onto the stack */
              if (likely(any(lhit)))
              {                                
                assert(sptr_node < stackEnd);
                assert(child != BVH::emptyNode);
                const vfloat<K> childDist = select(lhit, lnearP, inf);
                /* push cur node onto stack and continue with hit child */
                if (any(childDist < curDist))
                {
                  if (likely(cur != BVH::emptyNode)) {
                    num_child_hits++;
                    *sptr_node = cur; sptr_node++;
                    *sptr_near = curDist; sptr_near++;
                  }
                  curDist = childDist;
                  cur = child;
                }

                /* push hit child onto stack */
                else {
                  num_child_hits++;                  
                  *sptr_node = child; sptr_node++;
                  *sptr_near = childDist; sptr_near++;
                }
              }
            }

#if defined(__AVX__)
            //STAT3(normal.trav_hit_boxes[num_child_hits], 1, 1, 1);
#endif

            if (unlikely(cur == BVH::emptyNode))
              goto pop;
            
            /* improved distance sorting for 3 or more hits */
            if (unlikely(num_child_hits >= 2))
            {
              if (any(sptr_near[-2] < sptr_near[-1]))
              {
                std::swap(sptr_near[-2],sptr_near[-1]);
                std::swap(sptr_node[-2],sptr_node[-1]);
              }
              if (unlikely(num_child_hits >= 3))
              {
                if (any(sptr_near[-3] < sptr_near[-1]))
                {
                  std::swap(sptr_near[-3],sptr_near[-1]);
                  std::swap(sptr_node[-3],sptr_node[-1]);
                }
                if (any(sptr_near[-3] < sptr_near[-2]))
                {
                  std::swap(sptr_near[-3],sptr_near[-2]);
                  std::swap(sptr_node[-3],sptr_node[-2]);
                }
              }
            }

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
            if (single)
            {
              // seems to be the best place for testing utilization
              if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
              {
                *sptr_node++ = cur;
                *sptr_near++ = curDist;
                goto pop;
              }
            }
#endif
          }

          /* return if stack is empty */
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* intersect leaf */
          assert(cur != BVH::emptyNode);
          const vbool<K> valid_leaf = tray.tfar > curDist;
          STAT3(normal.trav_leaves, 1, popcnt(valid_leaf), K);
          if (unlikely(none(valid_leaf))) continue;
          size_t items; const Primitive* prim = (Primitive*)cur.leaf(items);

          size_t lazy_node = 0;
          PrimitiveIntersectorK::intersect(valid_leaf, This, pre, ray, context, prim, items, tray, lazy_node);
          tray.tfar = select(valid_leaf, ray.tfar, tray.tfar);

          if (unlikely(lazy_node)) {
            *sptr_node = lazy_node; sptr_node++;
            *sptr_near = neg_inf;   sptr_near++;
          }
        }
      } while(valid_bits);
    }